

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O2

bool __thiscall SemanticAnalyzer::isValid(SemanticAnalyzer *this,shared_ptr<ScriptAstNode> *script)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ostream *out;
  undefined1 local_f0 [8];
  SemanticAnalyzerRun run;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  out = this->out;
  this_00 = &run.currentScope.super___shared_ptr<Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &(this->reader).super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>);
  SemanticAnalyzerRun::SemanticAnalyzerRun
            ((SemanticAnalyzerRun *)local_f0,out,(shared_ptr<const_Readable> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  AstWalker::visitScriptAstNode
            ((AstWalker *)local_f0,
             (script->super___shared_ptr<ScriptAstNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  SemanticAnalyzerRun::~SemanticAnalyzerRun((SemanticAnalyzerRun *)local_f0);
  return (bool)((byte)run.builtInFunctionArgumentCounts._M_h._M_single_bucket ^ 1);
}

Assistant:

bool SemanticAnalyzer::isValid(const std::shared_ptr<ScriptAstNode>& script) noexcept {

  SemanticAnalyzerRun run{this->out, this->reader};

  run.visitScriptAstNode(script.get());

  return !run.hasErrors();
}